

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob)

{
  undefined4 uVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  uint uVar15;
  size_t sVar16;
  ulong uVar17;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  size_t sVar26;
  ulong uVar27;
  size_t sVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float in_XMM1_Da;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar56;
  float fVar57;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar58;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint uVar59;
  uint uVar63;
  uint uVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar65;
  int *local_50;
  
  switch(this->operation) {
  case 0:
    iVar4 = reduction_op<std::plus<float>,std::plus<float>>
                      (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da);
    return iVar4;
  case 1:
    iVar4 = this->dim;
    fVar65 = this->coeff;
    uVar12 = bottom_blob->w;
    uVar17 = (ulong)uVar12;
    uVar15 = bottom_blob->h;
    sVar16 = (size_t)(int)uVar12;
    uVar13 = bottom_blob->c;
    uVar19 = (ulong)uVar13;
    sVar28 = (size_t)(int)uVar13;
    uVar9 = uVar15 * uVar12;
    if (iVar4 == 0) {
      if (((top_blob->dims != 1) || (top_blob->w != 1)) || (top_blob->elemsize != 4)) {
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->elemsize = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 4;
        top_blob->dims = 1;
        top_blob->w = 1;
        top_blob->h = 1;
        top_blob->c = 1;
        top_blob->cstep = 1;
        pvVar6 = malloc(0x20);
        lVar25 = 4;
LAB_001147e1:
        pvVar7 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar7 - 8) = pvVar6;
        top_blob->data = pvVar7;
        top_blob->refcount = (int *)((long)pvVar7 + lVar25);
        *(undefined4 *)((long)pvVar7 + lVar25) = 1;
      }
    }
    else {
      switch(iVar4) {
      case 1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar13)) || (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          auVar52 = ZEXT816(0);
          top_blob->elemsize = auVar52._0_8_;
          top_blob->dims = auVar52._8_4_;
          top_blob->w = auVar52._12_4_;
          top_blob->h = auVar52._0_4_;
          top_blob->c = auVar52._4_4_;
          top_blob->cstep = auVar52._8_8_;
          top_blob->data = (void *)auVar52._0_8_;
          top_blob->refcount = (int *)auVar52._8_8_;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar13;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar28;
          if (uVar13 != 0) {
            lVar25 = sVar28 * 4;
            sVar14 = sVar28 * 4 + 0x1c;
            goto LAB_001147d9;
          }
        }
        break;
      case 2:
        if ((((top_blob->dims != 2) || (top_blob->w != uVar15)) || (top_blob->h != uVar13)) ||
           (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar15;
          top_blob->h = uVar13;
          top_blob->c = 1;
          uVar59 = uVar13 * uVar15;
          goto LAB_001147af;
        }
        break;
      case -2:
        if (((top_blob->dims != 2) || (top_blob->w != uVar12)) ||
           ((top_blob->h != uVar15 || (top_blob->elemsize != 4)))) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar12;
          top_blob->h = uVar15;
          top_blob->c = 1;
          uVar59 = uVar9;
LAB_001147af:
          sVar26 = (size_t)(int)uVar59;
          top_blob->cstep = sVar26;
          if (uVar59 != 0) {
            sVar14 = sVar26 * 4 + 0x1c;
            lVar25 = sVar26 << 2;
LAB_001147d9:
            pvVar6 = malloc(sVar14);
            goto LAB_001147e1;
          }
        }
        break;
      case -1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar12)) || (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          auVar52 = ZEXT816(0);
          top_blob->elemsize = auVar52._0_8_;
          top_blob->dims = auVar52._8_4_;
          top_blob->w = auVar52._12_4_;
          top_blob->h = auVar52._0_4_;
          top_blob->c = auVar52._4_4_;
          top_blob->cstep = auVar52._8_8_;
          top_blob->data = (void *)auVar52._0_8_;
          top_blob->refcount = (int *)auVar52._8_8_;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar12;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar16;
          if (uVar12 != 0) {
            lVar25 = sVar16 * 4;
            sVar14 = sVar16 * 4 + 0x1c;
            goto LAB_001147d9;
          }
        }
      }
    }
    pvVar6 = top_blob->data;
    if (pvVar6 == (void *)0x0) {
      return -100;
    }
    sVar26 = top_blob->cstep;
    if (sVar26 * (long)top_blob->c == 0) {
      return -100;
    }
    if (iVar4 != 0) {
      switch(iVar4) {
      default:
        return 0;
      case 1:
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar7 = bottom_blob->data;
          uVar17 = 0;
          do {
            fVar29 = 0.0;
            if (0 < (int)uVar9) {
              uVar21 = 0;
              do {
                fVar29 = fVar29 + ABS(*(float *)((long)pvVar7 + uVar21 * 4));
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            *(float *)((long)pvVar6 + uVar17 * 4) = fVar29 * fVar65;
            uVar17 = uVar17 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar16 * sVar28);
          } while (uVar17 != uVar19);
          return 0;
        }
        return 0;
      case 2:
        if (0 < (int)uVar13) {
          pvVar7 = bottom_blob->data;
          sVar28 = bottom_blob->elemsize;
          sVar2 = bottom_blob->cstep;
          sVar3 = top_blob->elemsize;
          uVar13 = uVar12 - 1;
          uVar17 = 0;
          do {
            if (0 < (int)uVar15) {
              pvVar22 = (void *)(sVar28 * sVar2 * uVar17 + (long)pvVar7);
              uVar21 = 0;
              do {
                if ((int)uVar12 < 1) {
                  fVar29 = 0.0;
                }
                else {
                  fVar29 = *(float *)((long)pvVar22 + uVar21 * 4);
                  iVar4 = 4;
                  fVar47 = 0.0;
                  fVar56 = 0.0;
                  fVar57 = 0.0;
                  fVar58 = 0.0;
                  do {
                    fVar37 = fVar58;
                    fVar36 = fVar57;
                    fVar35 = fVar56;
                    fVar34 = fVar47;
                    fVar47 = fVar34 + ABS(fVar29);
                    fVar56 = fVar35 + ABS(fVar29);
                    fVar57 = fVar36 + ABS(fVar29);
                    fVar58 = fVar37 + ABS(fVar29);
                    iVar10 = iVar4 + -4;
                    iVar23 = iVar4 + (uVar12 + 3 & 0xfffffffc);
                    iVar4 = iVar10;
                  } while (iVar23 != 8);
                  uVar9 = -iVar10;
                  uVar59 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)(uVar9 ^ 0x80000000));
                  uVar63 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 1) ^ 0x80000000));
                  uVar64 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 2) ^ 0x80000000));
                  uVar9 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 3) ^ 0x80000000));
                  auVar38._0_4_ = (uint)fVar34 & uVar59;
                  auVar38._4_4_ = (uint)fVar35 & uVar63;
                  auVar38._8_4_ = (uint)fVar36 & uVar64;
                  auVar38._12_4_ = (uint)fVar37 & uVar9;
                  auVar48._0_4_ = ~uVar59 & (uint)fVar47;
                  auVar48._4_4_ = ~uVar63 & (uint)fVar56;
                  auVar48._8_4_ = ~uVar64 & (uint)fVar57;
                  auVar48._12_4_ = ~uVar9 & (uint)fVar58;
                  auVar48 = auVar48 | auVar38;
                  fVar29 = auVar48._12_4_ + auVar48._4_4_ + auVar48._8_4_ + auVar48._0_4_;
                }
                *(float *)((long)pvVar6 + uVar21 * 4 + sVar26 * sVar3 * uVar17) = fVar29 * fVar65;
                pvVar22 = (void *)((long)pvVar22 + sVar16 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar15);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar19);
          return 0;
        }
        return 0;
      case -2:
        uVar12 = (int)sVar26 * top_blob->c;
        if (0 < (int)uVar12) {
          memset(pvVar6,0,(ulong)uVar12 << 2);
        }
        if (0 < (int)uVar13) {
          pvVar7 = bottom_blob->data;
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar22 = top_blob->data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar21 = 0;
              do {
                *(float *)((long)pvVar22 + uVar21 * 4) =
                     ABS(*(float *)((long)pvVar7 + uVar21 * 4)) +
                     *(float *)((long)pvVar22 + uVar21 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            uVar17 = uVar17 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar16 * sVar28);
          } while (uVar17 != uVar19);
        }
        if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar6 + uVar17 * 4) = *(float *)((long)pvVar6 + uVar17 * 4) * fVar65;
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
          return 0;
        }
        return 0;
      case -1:
        goto switchD_00114870_caseD_ffffffff;
      }
    }
    if (uVar13 == 0) {
      uVar8 = 0;
      piVar5 = (int *)0x0;
      goto LAB_0011505d;
    }
    pvVar6 = malloc(sVar28 * 4 + 0x1c);
    uVar8 = (long)pvVar6 + 0x17U & 0xfffffffffffffff0;
    *(void **)(uVar8 - 8) = pvVar6;
    piVar5 = (int *)(uVar8 + sVar28 * 4);
    *(undefined4 *)(uVar8 + sVar28 * 4) = 1;
    if (uVar8 == 0) goto LAB_0011505d;
    if ((int)uVar13 < 1) {
LAB_00115415:
      fVar29 = 0.0;
    }
    else {
      sVar16 = bottom_blob->elemsize;
      sVar28 = bottom_blob->cstep;
      pvVar6 = bottom_blob->data;
      uVar17 = 0;
      do {
        fVar29 = 0.0;
        if (0 < (int)uVar9) {
          uVar21 = 0;
          do {
            fVar29 = fVar29 + ABS(*(float *)((long)pvVar6 + uVar21 * 4));
            uVar21 = uVar21 + 1;
          } while (uVar9 != uVar21);
        }
        *(float *)(uVar8 + uVar17 * 4) = fVar29;
        uVar17 = uVar17 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar16 * sVar28);
      } while (uVar17 != uVar19);
      if ((int)uVar13 < 1) goto LAB_00115415;
      fVar29 = 0.0;
      uVar17 = 0;
      do {
        fVar29 = fVar29 + *(float *)(uVar8 + uVar17 * 4);
        uVar17 = uVar17 + 1;
      } while (uVar19 != uVar17);
    }
    fVar29 = fVar29 * fVar65;
    goto LAB_00116d1f;
  case 2:
    iVar4 = this->dim;
    fVar65 = this->coeff;
    uVar12 = bottom_blob->w;
    uVar17 = (ulong)uVar12;
    uVar15 = bottom_blob->h;
    sVar28 = (size_t)(int)uVar12;
    uVar13 = bottom_blob->c;
    uVar19 = (ulong)uVar13;
    sVar16 = (size_t)(int)uVar13;
    uVar9 = uVar15 * uVar12;
    if (iVar4 == 0) {
      if (((top_blob->dims != 1) || (top_blob->w != 1)) || (top_blob->elemsize != 4)) {
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->elemsize = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 4;
        top_blob->dims = 1;
        top_blob->w = 1;
        top_blob->h = 1;
        top_blob->c = 1;
        top_blob->cstep = 1;
        pvVar6 = malloc(0x20);
        lVar25 = 4;
LAB_001144a0:
        pvVar7 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar7 - 8) = pvVar6;
        top_blob->data = pvVar7;
        top_blob->refcount = (int *)((long)pvVar7 + lVar25);
        *(undefined4 *)((long)pvVar7 + lVar25) = 1;
      }
    }
    else {
      switch(iVar4) {
      case 1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar13)) || (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          auVar52 = ZEXT816(0);
          top_blob->elemsize = auVar52._0_8_;
          top_blob->dims = auVar52._8_4_;
          top_blob->w = auVar52._12_4_;
          top_blob->h = auVar52._0_4_;
          top_blob->c = auVar52._4_4_;
          top_blob->cstep = auVar52._8_8_;
          top_blob->data = (void *)auVar52._0_8_;
          top_blob->refcount = (int *)auVar52._8_8_;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar13;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar16;
          if (uVar13 != 0) {
            lVar25 = sVar16 * 4;
            sVar14 = sVar16 * 4 + 0x1c;
            goto LAB_00114498;
          }
        }
        break;
      case 2:
        if (((top_blob->dims != 2) || (top_blob->w != uVar15)) ||
           ((top_blob->h != uVar13 || (top_blob->elemsize != 4)))) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar15;
          top_blob->h = uVar13;
          top_blob->c = 1;
          uVar59 = uVar13 * uVar15;
          goto LAB_0011446e;
        }
        break;
      case -2:
        if ((((top_blob->dims != 2) || (top_blob->w != uVar12)) || (top_blob->h != uVar15)) ||
           (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar12;
          top_blob->h = uVar15;
          top_blob->c = 1;
          uVar59 = uVar9;
LAB_0011446e:
          sVar26 = (size_t)(int)uVar59;
          top_blob->cstep = sVar26;
          if (uVar59 != 0) {
            sVar14 = sVar26 * 4 + 0x1c;
            lVar25 = sVar26 << 2;
LAB_00114498:
            pvVar6 = malloc(sVar14);
            goto LAB_001144a0;
          }
        }
        break;
      case -1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar12)) || (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          auVar52 = ZEXT816(0);
          top_blob->elemsize = auVar52._0_8_;
          top_blob->dims = auVar52._8_4_;
          top_blob->w = auVar52._12_4_;
          top_blob->h = auVar52._0_4_;
          top_blob->c = auVar52._4_4_;
          top_blob->cstep = auVar52._8_8_;
          top_blob->data = (void *)auVar52._0_8_;
          top_blob->refcount = (int *)auVar52._8_8_;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar12;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar28;
          if (uVar12 != 0) {
            lVar25 = sVar28 * 4;
            sVar14 = sVar28 * 4 + 0x1c;
            goto LAB_00114498;
          }
        }
      }
    }
    pvVar6 = top_blob->data;
    if (pvVar6 == (void *)0x0) {
      return -100;
    }
    sVar26 = top_blob->cstep;
    if (sVar26 * (long)top_blob->c == 0) {
      return -100;
    }
    if (iVar4 != 0) {
      switch(iVar4) {
      default:
        return 0;
      case 1:
        if (0 < (int)uVar13) {
          pvVar7 = bottom_blob->data;
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          uVar17 = 0;
          do {
            fVar29 = 0.0;
            if (0 < (int)uVar9) {
              uVar21 = 0;
              do {
                fVar47 = *(float *)((long)pvVar7 + uVar21 * 4);
                fVar29 = fVar29 + fVar47 * fVar47;
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            *(float *)((long)pvVar6 + uVar17 * 4) = fVar29 * fVar65;
            uVar17 = uVar17 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar16 * sVar28);
          } while (uVar17 != uVar19);
          return 0;
        }
        return 0;
      case 2:
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar2 = bottom_blob->cstep;
          pvVar7 = bottom_blob->data;
          sVar3 = top_blob->elemsize;
          uVar13 = uVar12 - 1;
          uVar17 = 0;
          do {
            if (0 < (int)uVar15) {
              pvVar22 = (void *)(sVar16 * sVar2 * uVar17 + (long)pvVar7);
              uVar21 = 0;
              do {
                if ((int)uVar12 < 1) {
                  fVar29 = 0.0;
                }
                else {
                  fVar29 = *(float *)((long)pvVar22 + uVar21 * 4);
                  fVar29 = fVar29 * fVar29;
                  iVar4 = 4;
                  fVar47 = 0.0;
                  fVar56 = 0.0;
                  fVar57 = 0.0;
                  fVar58 = 0.0;
                  do {
                    fVar37 = fVar58;
                    fVar36 = fVar57;
                    fVar35 = fVar56;
                    fVar34 = fVar47;
                    fVar47 = fVar34 + fVar29;
                    fVar56 = fVar35 + fVar29;
                    fVar57 = fVar36 + fVar29;
                    fVar58 = fVar37 + fVar29;
                    iVar10 = iVar4 + -4;
                    iVar23 = iVar4 + (uVar12 + 3 & 0xfffffffc);
                    iVar4 = iVar10;
                  } while (iVar23 != 8);
                  uVar9 = -iVar10;
                  uVar59 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)(uVar9 ^ 0x80000000));
                  uVar63 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 1) ^ 0x80000000));
                  uVar64 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 2) ^ 0x80000000));
                  uVar9 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 3) ^ 0x80000000));
                  fVar29 = (float)(~uVar9 & (uint)fVar58 | (uint)fVar37 & uVar9) +
                           (float)(~uVar63 & (uint)fVar56 | (uint)fVar35 & uVar63) +
                           (float)(~uVar64 & (uint)fVar57 | (uint)fVar36 & uVar64) +
                           (float)(~uVar59 & (uint)fVar47 | (uint)fVar34 & uVar59);
                }
                *(float *)((long)pvVar6 + uVar21 * 4 + sVar26 * sVar3 * uVar17) = fVar29 * fVar65;
                pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar15);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar19);
          return 0;
        }
        return 0;
      case -2:
        uVar12 = (int)sVar26 * top_blob->c;
        if (0 < (int)uVar12) {
          memset(pvVar6,0,(ulong)uVar12 << 2);
        }
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar7 = bottom_blob->data;
          pvVar22 = top_blob->data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar21 = 0;
              do {
                fVar29 = *(float *)((long)pvVar7 + uVar21 * 4);
                *(float *)((long)pvVar22 + uVar21 * 4) =
                     fVar29 * fVar29 + *(float *)((long)pvVar22 + uVar21 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            uVar17 = uVar17 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar16 * sVar28);
          } while (uVar17 != uVar19);
        }
        if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar6 + uVar17 * 4) = *(float *)((long)pvVar6 + uVar17 * 4) * fVar65;
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
          return 0;
        }
        return 0;
      case -1:
        goto switchD_0011452f_caseD_ffffffff;
      }
    }
    if (uVar13 == 0) {
      uVar8 = 0;
      piVar5 = (int *)0x0;
    }
    else {
      pvVar6 = malloc(sVar16 * 4 + 0x1c);
      uVar8 = (long)pvVar6 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar8 - 8) = pvVar6;
      piVar5 = (int *)(uVar8 + sVar16 * 4);
      *(undefined4 *)(uVar8 + sVar16 * 4) = 1;
      if (uVar8 != 0) {
        if ((int)uVar13 < 1) {
LAB_00115409:
          fVar29 = 0.0;
        }
        else {
          pvVar6 = bottom_blob->data;
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          uVar17 = 0;
          do {
            fVar29 = 0.0;
            if (0 < (int)uVar9) {
              uVar21 = 0;
              do {
                fVar47 = *(float *)((long)pvVar6 + uVar21 * 4);
                fVar29 = fVar29 + fVar47 * fVar47;
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            *(float *)(uVar8 + uVar17 * 4) = fVar29;
            uVar17 = uVar17 + 1;
            pvVar6 = (void *)((long)pvVar6 + sVar16 * sVar28);
          } while (uVar17 != uVar19);
          if ((int)uVar13 < 1) goto LAB_00115409;
          fVar29 = 0.0;
          uVar17 = 0;
          do {
            fVar29 = fVar29 + *(float *)(uVar8 + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar19 != uVar17);
        }
        fVar29 = fVar29 * fVar65;
        goto LAB_00116d1f;
      }
    }
LAB_0011505d:
    if (piVar5 == (int *)0x0) {
      return -100;
    }
    LOCK();
    iVar4 = *piVar5;
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (uVar8 == 0) {
      return -100;
    }
    if (iVar4 != 1) {
      return -100;
    }
    goto LAB_001173dc;
  case 3:
    iVar4 = reduction_op<std::plus<float>,std::plus<float>>
                      (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da);
    if (iVar4 != 0) {
      return -100;
    }
    if (this->dim + 2U < 5) {
      uVar12 = bottom_blob->w;
      uVar15 = bottom_blob->h;
      uVar13 = bottom_blob->c;
      uVar9 = uVar15 * uVar12;
      switch(this->dim) {
      case 0:
        *(float *)top_blob->data = *top_blob->data / (float)(int)(uVar13 * uVar9);
        break;
      case 1:
        if (0 < (int)uVar13) {
          pvVar6 = top_blob->data;
          uVar17 = 0;
          do {
            *(float *)((long)pvVar6 + uVar17 * 4) =
                 *(float *)((long)pvVar6 + uVar17 * 4) * (1.0 / (float)(int)uVar9);
            uVar17 = uVar17 + 1;
          } while (uVar13 != uVar17);
        }
        break;
      case 2:
        if (0 < (int)uVar13) {
          sVar16 = top_blob->cstep;
          sVar28 = top_blob->elemsize;
          pvVar6 = top_blob->data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar15) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar6 + uVar19 * 4) =
                     *(float *)((long)pvVar6 + uVar19 * 4) * (1.0 / (float)(int)uVar12);
                uVar19 = uVar19 + 1;
              } while (uVar15 != uVar19);
            }
            uVar17 = uVar17 + 1;
            pvVar6 = (void *)((long)pvVar6 + sVar16 * sVar28);
          } while (uVar17 != uVar13);
        }
        break;
      case -2:
        if (0 < (int)uVar9) {
          pvVar6 = top_blob->data;
          uVar17 = 0;
          do {
            *(float *)((long)pvVar6 + uVar17 * 4) =
                 *(float *)((long)pvVar6 + uVar17 * 4) * (1.0 / (float)(int)uVar13);
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
        }
        break;
      case -1:
        if (0 < (int)uVar12) {
          pvVar6 = top_blob->data;
          uVar17 = 0;
          do {
            *(float *)((long)pvVar6 + uVar17 * 4) =
                 *(float *)((long)pvVar6 + uVar17 * 4) * (1.0 / (float)(int)(uVar15 * uVar13));
            uVar17 = uVar17 + 1;
          } while (uVar12 != uVar17);
        }
      }
    }
  }
  iVar4 = this->operation;
  if (iVar4 == 6) {
    iVar4 = this->dim;
    fVar65 = this->coeff;
    uVar12 = bottom_blob->w;
    uVar19 = (ulong)uVar12;
    uVar15 = bottom_blob->h;
    sVar28 = (size_t)(int)uVar12;
    uVar13 = bottom_blob->c;
    uVar17 = (ulong)uVar13;
    sVar16 = (size_t)(int)uVar13;
    uVar9 = uVar15 * uVar12;
    if (iVar4 == 0) {
      if (((top_blob->dims != 1) || (top_blob->w != 1)) || (top_blob->elemsize != 4)) {
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->elemsize = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 4;
        top_blob->dims = 1;
        top_blob->w = 1;
        top_blob->h = 1;
        top_blob->c = 1;
        top_blob->cstep = 1;
        pvVar6 = malloc(0x20);
        lVar25 = 4;
LAB_00115d85:
        pvVar7 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar7 - 8) = pvVar6;
        top_blob->data = pvVar7;
        top_blob->refcount = (int *)((long)pvVar7 + lVar25);
        *(undefined4 *)((long)pvVar7 + lVar25) = 1;
      }
    }
    else {
      switch(iVar4) {
      case 1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar13)) || (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          auVar52 = ZEXT816(0);
          top_blob->elemsize = auVar52._0_8_;
          top_blob->dims = auVar52._8_4_;
          top_blob->w = auVar52._12_4_;
          top_blob->h = auVar52._0_4_;
          top_blob->c = auVar52._4_4_;
          top_blob->cstep = auVar52._8_8_;
          top_blob->data = (void *)auVar52._0_8_;
          top_blob->refcount = (int *)auVar52._8_8_;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar13;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar16;
          if (uVar13 != 0) {
            lVar25 = sVar16 * 4;
            sVar14 = sVar16 * 4 + 0x1c;
            goto LAB_00115d7d;
          }
        }
        break;
      case 2:
        if (((top_blob->dims != 2) || (top_blob->w != uVar15)) ||
           ((top_blob->h != uVar13 || (top_blob->elemsize != 4)))) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar15;
          top_blob->h = uVar13;
          top_blob->c = 1;
          uVar59 = uVar13 * uVar15;
          goto LAB_00115d4e;
        }
        break;
      case -2:
        if ((((top_blob->dims != 2) || (top_blob->w != uVar12)) || (top_blob->h != uVar15)) ||
           (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar12;
          top_blob->h = uVar15;
          top_blob->c = 1;
          uVar59 = uVar9;
LAB_00115d4e:
          sVar26 = (size_t)(int)uVar59;
          top_blob->cstep = sVar26;
          if (uVar59 != 0) {
            sVar14 = sVar26 * 4 + 0x1c;
            lVar25 = sVar26 << 2;
LAB_00115d7d:
            pvVar6 = malloc(sVar14);
            goto LAB_00115d85;
          }
        }
        break;
      case -1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar12)) || (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          auVar52 = ZEXT816(0);
          top_blob->elemsize = auVar52._0_8_;
          top_blob->dims = auVar52._8_4_;
          top_blob->w = auVar52._12_4_;
          top_blob->h = auVar52._0_4_;
          top_blob->c = auVar52._4_4_;
          top_blob->cstep = auVar52._8_8_;
          top_blob->data = (void *)auVar52._0_8_;
          top_blob->refcount = (int *)auVar52._8_8_;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar12;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar28;
          if (uVar12 != 0) {
            lVar25 = sVar28 * 4;
            sVar14 = sVar28 * 4 + 0x1c;
            goto LAB_00115d7d;
          }
        }
      }
    }
    auVar49 = _DAT_001334a0;
    auVar61 = _DAT_00133490;
    auVar52 = _DAT_00133420;
    pvVar6 = top_blob->data;
    if (pvVar6 == (void *)0x0) {
      return -100;
    }
    sVar26 = top_blob->cstep;
    if (sVar26 * (long)top_blob->c == 0) {
      return -100;
    }
    if (iVar4 != 0) {
      switch(iVar4) {
      default:
        return 0;
      case 1:
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar7 = bottom_blob->data;
          uVar19 = 0;
          do {
            fVar29 = 1.0;
            if (0 < (int)uVar9) {
              uVar21 = 0;
              fVar29 = 1.0;
              do {
                fVar29 = fVar29 * *(float *)((long)pvVar7 + uVar21 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            *(float *)((long)pvVar6 + uVar19 * 4) = fVar29 * fVar65;
            uVar19 = uVar19 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar16 * sVar28);
          } while (uVar19 != uVar17);
          return 0;
        }
        return 0;
      case 2:
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar2 = bottom_blob->cstep;
          sVar3 = top_blob->elemsize;
          pvVar7 = bottom_blob->data;
          uVar13 = uVar12 - 1;
          uVar19 = 0;
          do {
            if (0 < (int)uVar15) {
              pvVar22 = (void *)(sVar16 * sVar2 * uVar19 + (long)pvVar7);
              uVar21 = 0;
              do {
                fVar29 = 1.0;
                if (0 < (int)uVar12) {
                  fVar29 = *(float *)((long)pvVar22 + uVar21 * 4);
                  iVar4 = 4;
                  fVar47 = 1.0;
                  fVar56 = 1.0;
                  fVar57 = 1.0;
                  fVar58 = 1.0;
                  do {
                    fVar37 = fVar58;
                    fVar36 = fVar57;
                    fVar35 = fVar56;
                    fVar34 = fVar47;
                    fVar47 = fVar34 * fVar29;
                    fVar56 = fVar35 * fVar29;
                    fVar57 = fVar36 * fVar29;
                    fVar58 = fVar37 * fVar29;
                    iVar23 = iVar4 + -4;
                    iVar10 = (uVar12 + 3 & 0xfffffffc) + iVar4;
                    iVar4 = iVar23;
                  } while (iVar10 != 8);
                  uVar9 = -iVar23;
                  uVar59 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)(uVar9 ^ 0x80000000));
                  uVar63 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 1) ^ 0x80000000));
                  uVar64 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 2) ^ 0x80000000));
                  uVar9 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 3) ^ 0x80000000));
                  auVar52._0_4_ = (uint)fVar34 & uVar59;
                  auVar52._4_4_ = (uint)fVar35 & uVar63;
                  auVar52._8_4_ = (uint)fVar36 & uVar64;
                  auVar52._12_4_ = (uint)fVar37 & uVar9;
                  auVar61._0_4_ = ~uVar59 & (uint)fVar47;
                  auVar61._4_4_ = ~uVar63 & (uint)fVar56;
                  auVar61._8_4_ = ~uVar64 & (uint)fVar57;
                  auVar61._12_4_ = ~uVar9 & (uint)fVar58;
                  auVar61 = auVar61 | auVar52;
                  fVar29 = auVar61._12_4_ * auVar61._4_4_ * auVar61._8_4_ * auVar61._0_4_;
                }
                *(float *)((long)pvVar6 + uVar21 * 4 + sVar26 * sVar3 * uVar19) = fVar29 * fVar65;
                pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar15);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar17);
          return 0;
        }
        return 0;
      case -2:
        uVar12 = (int)sVar26 * top_blob->c;
        if (0 < (int)uVar12) {
          lVar25 = (ulong)uVar12 - 1;
          auVar54._8_4_ = (int)lVar25;
          auVar54._0_8_ = lVar25;
          auVar54._12_4_ = (int)((ulong)lVar25 >> 0x20);
          uVar19 = 0;
          auVar54 = auVar54 ^ _DAT_00133420;
          do {
            auVar40._8_4_ = (int)uVar19;
            auVar40._0_8_ = uVar19;
            auVar40._12_4_ = (int)(uVar19 >> 0x20);
            auVar55 = (auVar40 | auVar49) ^ auVar52;
            iVar4 = auVar54._4_4_;
            if ((bool)(~(auVar55._4_4_ == iVar4 && auVar54._0_4_ < auVar55._0_4_ ||
                        iVar4 < auVar55._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar6 + uVar19 * 4) = 0x3f800000;
            }
            if ((auVar55._12_4_ != auVar54._12_4_ || auVar55._8_4_ <= auVar54._8_4_) &&
                auVar55._12_4_ <= auVar54._12_4_) {
              *(undefined4 *)((long)pvVar6 + uVar19 * 4 + 4) = 0x3f800000;
            }
            auVar55 = (auVar40 | auVar61) ^ auVar52;
            iVar10 = auVar55._4_4_;
            if (iVar10 <= iVar4 && (iVar10 != iVar4 || auVar55._0_4_ <= auVar54._0_4_)) {
              *(undefined4 *)((long)pvVar6 + uVar19 * 4 + 8) = 0x3f800000;
              *(undefined4 *)((long)pvVar6 + uVar19 * 4 + 0xc) = 0x3f800000;
            }
            uVar19 = uVar19 + 4;
          } while ((uVar12 + 3 & 0xfffffffc) != uVar19);
        }
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar7 = bottom_blob->data;
          pvVar22 = top_blob->data;
          uVar19 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar21 = 0;
              do {
                *(float *)((long)pvVar22 + uVar21 * 4) =
                     *(float *)((long)pvVar7 + uVar21 * 4) * *(float *)((long)pvVar22 + uVar21 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            uVar19 = uVar19 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar16 * sVar28);
          } while (uVar19 != uVar17);
        }
        if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar6 + uVar17 * 4) = *(float *)((long)pvVar6 + uVar17 * 4) * fVar65;
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
          return 0;
        }
        return 0;
      case -1:
        goto switchD_00115e0d_caseD_ffffffff;
      }
    }
    if (uVar13 == 0) {
      uVar8 = 0;
      piVar5 = (int *)0x0;
    }
    else {
      pvVar6 = malloc(sVar16 * 4 + 0x1c);
      uVar8 = (long)pvVar6 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar8 - 8) = pvVar6;
      piVar5 = (int *)(uVar8 + sVar16 * 4);
      *(undefined4 *)(uVar8 + sVar16 * 4) = 1;
      if (uVar8 != 0) {
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar6 = bottom_blob->data;
          uVar19 = 0;
          do {
            fVar29 = 1.0;
            if (0 < (int)uVar9) {
              uVar21 = 0;
              fVar29 = 1.0;
              do {
                fVar29 = fVar29 * *(float *)((long)pvVar6 + uVar21 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            *(float *)(uVar8 + uVar19 * 4) = fVar29;
            uVar19 = uVar19 + 1;
            pvVar6 = (void *)((long)pvVar6 + sVar16 * sVar28);
          } while (uVar19 != uVar17);
          if (0 < (int)uVar13) {
            fVar29 = 1.0;
            uVar19 = 0;
            do {
              fVar29 = fVar29 * *(float *)(uVar8 + uVar19 * 4);
              uVar19 = uVar19 + 1;
            } while (uVar17 != uVar19);
            goto LAB_00116d1a;
          }
        }
        fVar29 = 1.0;
LAB_00116d1a:
        fVar29 = fVar29 * fVar65;
LAB_00116d1f:
        *(float *)top_blob->data = fVar29;
        goto LAB_00116d26;
      }
    }
  }
  else if (iVar4 == 5) {
    iVar4 = this->dim;
    fVar65 = this->coeff;
    uVar12 = bottom_blob->w;
    uVar19 = (ulong)uVar12;
    uVar15 = bottom_blob->h;
    sVar28 = (size_t)(int)uVar12;
    uVar13 = bottom_blob->c;
    uVar17 = (ulong)uVar13;
    sVar16 = (size_t)(int)uVar13;
    uVar9 = uVar15 * uVar12;
    if (iVar4 == 0) {
      if (((top_blob->dims != 1) || (top_blob->w != 1)) || (top_blob->elemsize != 4)) {
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->elemsize = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 4;
        top_blob->dims = 1;
        top_blob->w = 1;
        top_blob->h = 1;
        top_blob->c = 1;
        top_blob->cstep = 1;
        pvVar6 = malloc(0x20);
        lVar25 = 4;
LAB_00115973:
        pvVar7 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar7 - 8) = pvVar6;
        top_blob->data = pvVar7;
        top_blob->refcount = (int *)((long)pvVar7 + lVar25);
        *(undefined4 *)((long)pvVar7 + lVar25) = 1;
      }
    }
    else {
      switch(iVar4) {
      case 1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar13)) || (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          auVar52 = ZEXT816(0);
          top_blob->elemsize = auVar52._0_8_;
          top_blob->dims = auVar52._8_4_;
          top_blob->w = auVar52._12_4_;
          top_blob->h = auVar52._0_4_;
          top_blob->c = auVar52._4_4_;
          top_blob->cstep = auVar52._8_8_;
          top_blob->data = (void *)auVar52._0_8_;
          top_blob->refcount = (int *)auVar52._8_8_;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar13;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar16;
          if (uVar13 != 0) {
            lVar25 = sVar16 * 4;
            sVar14 = sVar16 * 4 + 0x1c;
            goto LAB_0011596b;
          }
        }
        break;
      case 2:
        if ((((top_blob->dims != 2) || (top_blob->w != uVar15)) || (top_blob->h != uVar13)) ||
           (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar15;
          top_blob->h = uVar13;
          top_blob->c = 1;
          uVar59 = uVar13 * uVar15;
          goto LAB_0011593c;
        }
        break;
      case -2:
        if (((top_blob->dims != 2) || (top_blob->w != uVar12)) ||
           ((top_blob->h != uVar15 || (top_blob->elemsize != 4)))) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar12;
          top_blob->h = uVar15;
          top_blob->c = 1;
          uVar59 = uVar9;
LAB_0011593c:
          sVar26 = (size_t)(int)uVar59;
          top_blob->cstep = sVar26;
          if (uVar59 != 0) {
            sVar14 = sVar26 * 4 + 0x1c;
            lVar25 = sVar26 << 2;
LAB_0011596b:
            pvVar6 = malloc(sVar14);
            goto LAB_00115973;
          }
        }
        break;
      case -1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar12)) || (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          auVar52 = ZEXT816(0);
          top_blob->elemsize = auVar52._0_8_;
          top_blob->dims = auVar52._8_4_;
          top_blob->w = auVar52._12_4_;
          top_blob->h = auVar52._0_4_;
          top_blob->c = auVar52._4_4_;
          top_blob->cstep = auVar52._8_8_;
          top_blob->data = (void *)auVar52._0_8_;
          top_blob->refcount = (int *)auVar52._8_8_;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar12;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar28;
          if (uVar12 != 0) {
            lVar25 = sVar28 * 4;
            sVar14 = sVar28 * 4 + 0x1c;
            goto LAB_0011596b;
          }
        }
      }
    }
    auVar55 = _DAT_00133720;
    auVar49 = _DAT_001334a0;
    auVar61 = _DAT_00133490;
    auVar52 = _DAT_00133420;
    pvVar6 = top_blob->data;
    if (pvVar6 == (void *)0x0) {
      return -100;
    }
    sVar26 = top_blob->cstep;
    if (sVar26 * (long)top_blob->c == 0) {
      return -100;
    }
    if (iVar4 != 0) {
      switch(iVar4) {
      default:
        return 0;
      case 1:
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar7 = bottom_blob->data;
          uVar19 = 0;
          do {
            fVar29 = 3.4028235e+38;
            if (0 < (int)uVar9) {
              uVar21 = 0;
              fVar29 = 3.4028235e+38;
              do {
                fVar47 = *(float *)((long)pvVar7 + uVar21 * 4);
                if (fVar47 <= fVar29) {
                  fVar29 = fVar47;
                }
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            *(float *)((long)pvVar6 + uVar19 * 4) = fVar29 * fVar65;
            uVar19 = uVar19 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar16 * sVar28);
          } while (uVar19 != uVar17);
          return 0;
        }
        return 0;
      case 2:
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar2 = bottom_blob->cstep;
          sVar3 = top_blob->elemsize;
          pvVar7 = bottom_blob->data;
          uVar13 = uVar12 - 1;
          uVar19 = 0;
          do {
            if (0 < (int)uVar15) {
              pvVar22 = (void *)(sVar16 * sVar2 * uVar19 + (long)pvVar7);
              uVar21 = 0;
              do {
                fVar29 = 3.4028235e+38;
                if (0 < (int)uVar12) {
                  uVar1 = *(undefined4 *)((long)pvVar22 + uVar21 * 4);
                  auVar49._4_4_ = uVar1;
                  auVar49._0_4_ = uVar1;
                  auVar52 = auVar55;
                  iVar4 = 4;
                  do {
                    auVar61 = auVar52;
                    auVar49._8_4_ = uVar1;
                    auVar49._12_4_ = uVar1;
                    auVar52 = minps(auVar49,auVar61);
                    iVar23 = iVar4 + -4;
                    iVar10 = (uVar12 + 3 & 0xfffffffc) + iVar4;
                    iVar4 = iVar23;
                  } while (iVar10 != 8);
                  uVar9 = -iVar23;
                  uVar59 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)(uVar9 ^ 0x80000000));
                  uVar63 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 1) ^ 0x80000000));
                  uVar64 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 2) ^ 0x80000000));
                  uVar9 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 3) ^ 0x80000000));
                  auVar42._0_4_ = auVar61._0_4_ & uVar59;
                  auVar42._4_4_ = auVar61._4_4_ & uVar63;
                  auVar42._8_4_ = auVar61._8_4_ & uVar64;
                  auVar42._12_4_ = auVar61._12_4_ & uVar9;
                  auVar60._0_4_ = ~uVar59 & auVar52._0_4_;
                  auVar60._4_4_ = ~uVar63 & auVar52._4_4_;
                  auVar60._8_4_ = ~uVar64 & auVar52._8_4_;
                  auVar60._12_4_ = ~uVar9 & auVar52._12_4_;
                  auVar60 = auVar60 | auVar42;
                  auVar50._0_8_ = auVar60._8_8_;
                  auVar50._8_4_ = auVar60._8_4_;
                  auVar50._12_4_ = auVar60._12_4_;
                  auVar52 = minps(auVar50,auVar60);
                  fVar29 = auVar52._4_4_;
                  if (auVar52._0_4_ <= auVar52._4_4_) {
                    fVar29 = auVar52._0_4_;
                  }
                }
                *(float *)((long)pvVar6 + uVar21 * 4 + sVar26 * sVar3 * uVar19) = fVar29 * fVar65;
                pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar15);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar17);
          return 0;
        }
        return 0;
      case -2:
        uVar12 = (int)sVar26 * top_blob->c;
        if (0 < (int)uVar12) {
          lVar25 = (ulong)uVar12 - 1;
          auVar30._8_4_ = (int)lVar25;
          auVar30._0_8_ = lVar25;
          auVar30._12_4_ = (int)((ulong)lVar25 >> 0x20);
          uVar19 = 0;
          auVar30 = auVar30 ^ _DAT_00133420;
          do {
            auVar39._8_4_ = (int)uVar19;
            auVar39._0_8_ = uVar19;
            auVar39._12_4_ = (int)(uVar19 >> 0x20);
            auVar55 = (auVar39 | auVar49) ^ auVar52;
            iVar4 = auVar30._4_4_;
            if ((bool)(~(auVar55._4_4_ == iVar4 && auVar30._0_4_ < auVar55._0_4_ ||
                        iVar4 < auVar55._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar6 + uVar19 * 4) = 0x7f7fffff;
            }
            if ((auVar55._12_4_ != auVar30._12_4_ || auVar55._8_4_ <= auVar30._8_4_) &&
                auVar55._12_4_ <= auVar30._12_4_) {
              *(undefined4 *)((long)pvVar6 + uVar19 * 4 + 4) = 0x7f7fffff;
            }
            auVar55 = (auVar39 | auVar61) ^ auVar52;
            iVar10 = auVar55._4_4_;
            if (iVar10 <= iVar4 && (iVar10 != iVar4 || auVar55._0_4_ <= auVar30._0_4_)) {
              *(undefined4 *)((long)pvVar6 + uVar19 * 4 + 8) = 0x7f7fffff;
              *(undefined4 *)((long)pvVar6 + uVar19 * 4 + 0xc) = 0x7f7fffff;
            }
            uVar19 = uVar19 + 4;
          } while ((uVar12 + 3 & 0xfffffffc) != uVar19);
        }
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar7 = bottom_blob->data;
          pvVar22 = top_blob->data;
          uVar19 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar21 = 0;
              do {
                fVar47 = *(float *)((long)pvVar7 + uVar21 * 4);
                fVar29 = *(float *)((long)pvVar22 + uVar21 * 4);
                if (fVar29 <= fVar47) {
                  fVar47 = fVar29;
                }
                *(float *)((long)pvVar22 + uVar21 * 4) = fVar47;
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            uVar19 = uVar19 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar16 * sVar28);
          } while (uVar19 != uVar17);
        }
        if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar6 + uVar17 * 4) = *(float *)((long)pvVar6 + uVar17 * 4) * fVar65;
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
          return 0;
        }
        return 0;
      case -1:
        goto switchD_001159fb_caseD_ffffffff;
      }
    }
    if (uVar13 == 0) {
      uVar8 = 0;
      piVar5 = (int *)0x0;
    }
    else {
      pvVar6 = malloc(sVar16 * 4 + 0x1c);
      uVar8 = (long)pvVar6 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar8 - 8) = pvVar6;
      piVar5 = (int *)(uVar8 + sVar16 * 4);
      *(undefined4 *)(uVar8 + sVar16 * 4) = 1;
      if (uVar8 != 0) {
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar6 = bottom_blob->data;
          uVar19 = 0;
          do {
            fVar29 = 3.4028235e+38;
            if (0 < (int)uVar9) {
              uVar21 = 0;
              fVar29 = 3.4028235e+38;
              do {
                fVar47 = *(float *)((long)pvVar6 + uVar21 * 4);
                if (fVar47 <= fVar29) {
                  fVar29 = fVar47;
                }
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            *(float *)(uVar8 + uVar19 * 4) = fVar29;
            uVar19 = uVar19 + 1;
            pvVar6 = (void *)((long)pvVar6 + sVar16 * sVar28);
          } while (uVar19 != uVar17);
          if (0 < (int)uVar13) {
            fVar29 = 3.4028235e+38;
            uVar19 = 0;
            do {
              fVar47 = *(float *)(uVar8 + uVar19 * 4);
              if (fVar47 <= fVar29) {
                fVar29 = fVar47;
              }
              uVar19 = uVar19 + 1;
            } while (uVar17 != uVar19);
            goto LAB_00116d1a;
          }
        }
        fVar29 = 3.4028235e+38;
        goto LAB_00116d1a;
      }
    }
  }
  else {
    if (iVar4 != 4) {
      return 0;
    }
    iVar4 = this->dim;
    fVar65 = this->coeff;
    uVar12 = bottom_blob->w;
    uVar19 = (ulong)uVar12;
    uVar15 = bottom_blob->h;
    sVar28 = (size_t)(int)uVar12;
    uVar13 = bottom_blob->c;
    uVar17 = (ulong)uVar13;
    sVar16 = (size_t)(int)uVar13;
    uVar9 = uVar15 * uVar12;
    if (iVar4 == 0) {
      if (((top_blob->dims != 1) || (top_blob->w != 1)) || (top_blob->elemsize != 4)) {
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->elemsize = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 4;
        top_blob->dims = 1;
        top_blob->w = 1;
        top_blob->h = 1;
        top_blob->c = 1;
        top_blob->cstep = 1;
        pvVar6 = malloc(0x20);
        lVar25 = 4;
LAB_001160bb:
        pvVar7 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar7 - 8) = pvVar6;
        top_blob->data = pvVar7;
        top_blob->refcount = (int *)((long)pvVar7 + lVar25);
        *(undefined4 *)((long)pvVar7 + lVar25) = 1;
      }
    }
    else {
      switch(iVar4) {
      case 1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar13)) || (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          auVar52 = ZEXT816(0);
          top_blob->elemsize = auVar52._0_8_;
          top_blob->dims = auVar52._8_4_;
          top_blob->w = auVar52._12_4_;
          top_blob->h = auVar52._0_4_;
          top_blob->c = auVar52._4_4_;
          top_blob->cstep = auVar52._8_8_;
          top_blob->data = (void *)auVar52._0_8_;
          top_blob->refcount = (int *)auVar52._8_8_;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar13;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar16;
          if (uVar13 != 0) {
            lVar25 = sVar16 * 4;
            sVar14 = sVar16 * 4 + 0x1c;
            goto LAB_001160b3;
          }
        }
        break;
      case 2:
        if (((top_blob->dims != 2) || (top_blob->w != uVar15)) ||
           ((top_blob->h != uVar13 || (top_blob->elemsize != 4)))) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar15;
          top_blob->h = uVar13;
          top_blob->c = 1;
          uVar59 = uVar13 * uVar15;
          goto LAB_00116084;
        }
        break;
      case -2:
        if ((((top_blob->dims != 2) || (top_blob->w != uVar12)) || (top_blob->h != uVar15)) ||
           (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar12;
          top_blob->h = uVar15;
          top_blob->c = 1;
          uVar59 = uVar9;
LAB_00116084:
          sVar26 = (size_t)(int)uVar59;
          top_blob->cstep = sVar26;
          if (uVar59 != 0) {
            sVar14 = sVar26 * 4 + 0x1c;
            lVar25 = sVar26 << 2;
LAB_001160b3:
            pvVar6 = malloc(sVar14);
            goto LAB_001160bb;
          }
        }
        break;
      case -1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar12)) || (top_blob->elemsize != 4)) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if ((*piVar5 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          auVar52 = ZEXT816(0);
          top_blob->elemsize = auVar52._0_8_;
          top_blob->dims = auVar52._8_4_;
          top_blob->w = auVar52._12_4_;
          top_blob->h = auVar52._0_4_;
          top_blob->c = auVar52._4_4_;
          top_blob->cstep = auVar52._8_8_;
          top_blob->data = (void *)auVar52._0_8_;
          top_blob->refcount = (int *)auVar52._8_8_;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar12;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar28;
          if (uVar12 != 0) {
            lVar25 = sVar28 * 4;
            sVar14 = sVar28 * 4 + 0x1c;
            goto LAB_001160b3;
          }
        }
      }
    }
    auVar55 = _DAT_00133730;
    auVar49 = _DAT_001334a0;
    auVar61 = _DAT_00133490;
    auVar52 = _DAT_00133420;
    pvVar6 = top_blob->data;
    if (pvVar6 == (void *)0x0) {
      return -100;
    }
    sVar26 = top_blob->cstep;
    if (sVar26 * (long)top_blob->c == 0) {
      return -100;
    }
    if (iVar4 != 0) {
      switch(iVar4) {
      default:
        return 0;
      case 1:
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar7 = bottom_blob->data;
          uVar19 = 0;
          do {
            fVar29 = -3.4028235e+38;
            if (0 < (int)uVar9) {
              uVar21 = 0;
              fVar29 = -3.4028235e+38;
              do {
                fVar47 = *(float *)((long)pvVar7 + uVar21 * 4);
                if (fVar29 <= fVar47) {
                  fVar29 = fVar47;
                }
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            *(float *)((long)pvVar6 + uVar19 * 4) = fVar29 * fVar65;
            uVar19 = uVar19 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar16 * sVar28);
          } while (uVar19 != uVar17);
          return 0;
        }
        return 0;
      case 2:
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar2 = bottom_blob->cstep;
          sVar3 = top_blob->elemsize;
          pvVar7 = bottom_blob->data;
          uVar13 = uVar12 - 1;
          uVar19 = 0;
          do {
            if (0 < (int)uVar15) {
              pvVar22 = (void *)(sVar16 * sVar2 * uVar19 + (long)pvVar7);
              uVar21 = 0;
              do {
                fVar29 = -3.4028235e+38;
                if (0 < (int)uVar12) {
                  uVar1 = *(undefined4 *)((long)pvVar22 + uVar21 * 4);
                  auVar51._4_4_ = uVar1;
                  auVar51._0_4_ = uVar1;
                  auVar52 = auVar55;
                  iVar4 = 4;
                  do {
                    auVar61 = auVar52;
                    auVar51._8_4_ = uVar1;
                    auVar51._12_4_ = uVar1;
                    auVar52 = maxps(auVar51,auVar61);
                    iVar23 = iVar4 + -4;
                    iVar10 = (uVar12 + 3 & 0xfffffffc) + iVar4;
                    iVar4 = iVar23;
                  } while (iVar10 != 8);
                  uVar9 = -iVar23;
                  uVar59 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)(uVar9 ^ 0x80000000));
                  uVar63 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 1) ^ 0x80000000));
                  uVar64 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 2) ^ 0x80000000));
                  uVar9 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar9 | 3) ^ 0x80000000));
                  auVar43._0_4_ = auVar61._0_4_ & uVar59;
                  auVar43._4_4_ = auVar61._4_4_ & uVar63;
                  auVar43._8_4_ = auVar61._8_4_ & uVar64;
                  auVar43._12_4_ = auVar61._12_4_ & uVar9;
                  auVar62._0_4_ = ~uVar59 & auVar52._0_4_;
                  auVar62._4_4_ = ~uVar63 & auVar52._4_4_;
                  auVar62._8_4_ = ~uVar64 & auVar52._8_4_;
                  auVar62._12_4_ = ~uVar9 & auVar52._12_4_;
                  auVar62 = auVar62 | auVar43;
                  auVar53._0_8_ = auVar62._8_8_;
                  auVar53._8_4_ = auVar62._8_4_;
                  auVar53._12_4_ = auVar62._12_4_;
                  auVar52 = maxps(auVar53,auVar62);
                  fVar29 = auVar52._4_4_;
                  if (auVar52._4_4_ <= auVar52._0_4_) {
                    fVar29 = auVar52._0_4_;
                  }
                }
                *(float *)((long)pvVar6 + uVar21 * 4 + sVar26 * sVar3 * uVar19) = fVar29 * fVar65;
                pvVar22 = (void *)((long)pvVar22 + sVar28 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar15);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar17);
          return 0;
        }
        return 0;
      case -2:
        uVar12 = (int)sVar26 * top_blob->c;
        if (0 < (int)uVar12) {
          lVar25 = (ulong)uVar12 - 1;
          auVar31._8_4_ = (int)lVar25;
          auVar31._0_8_ = lVar25;
          auVar31._12_4_ = (int)((ulong)lVar25 >> 0x20);
          uVar19 = 0;
          auVar31 = auVar31 ^ _DAT_00133420;
          do {
            auVar41._8_4_ = (int)uVar19;
            auVar41._0_8_ = uVar19;
            auVar41._12_4_ = (int)(uVar19 >> 0x20);
            auVar55 = (auVar41 | auVar49) ^ auVar52;
            iVar4 = auVar31._4_4_;
            if ((bool)(~(auVar55._4_4_ == iVar4 && auVar31._0_4_ < auVar55._0_4_ ||
                        iVar4 < auVar55._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar6 + uVar19 * 4) = 0xff7fffff;
            }
            if ((auVar55._12_4_ != auVar31._12_4_ || auVar55._8_4_ <= auVar31._8_4_) &&
                auVar55._12_4_ <= auVar31._12_4_) {
              *(undefined4 *)((long)pvVar6 + uVar19 * 4 + 4) = 0xff7fffff;
            }
            auVar55 = (auVar41 | auVar61) ^ auVar52;
            iVar10 = auVar55._4_4_;
            if (iVar10 <= iVar4 && (iVar10 != iVar4 || auVar55._0_4_ <= auVar31._0_4_)) {
              *(undefined4 *)((long)pvVar6 + uVar19 * 4 + 8) = 0xff7fffff;
              *(undefined4 *)((long)pvVar6 + uVar19 * 4 + 0xc) = 0xff7fffff;
            }
            uVar19 = uVar19 + 4;
          } while ((uVar12 + 3 & 0xfffffffc) != uVar19);
        }
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar7 = bottom_blob->data;
          pvVar22 = top_blob->data;
          uVar19 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar21 = 0;
              do {
                fVar47 = *(float *)((long)pvVar7 + uVar21 * 4);
                fVar29 = *(float *)((long)pvVar22 + uVar21 * 4);
                if (fVar47 <= fVar29) {
                  fVar47 = fVar29;
                }
                *(float *)((long)pvVar22 + uVar21 * 4) = fVar47;
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            uVar19 = uVar19 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar16 * sVar28);
          } while (uVar19 != uVar17);
        }
        if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar6 + uVar17 * 4) = *(float *)((long)pvVar6 + uVar17 * 4) * fVar65;
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
          return 0;
        }
        return 0;
      case -1:
        goto switchD_00116143_caseD_ffffffff;
      }
    }
    if (uVar13 == 0) {
      uVar8 = 0;
      piVar5 = (int *)0x0;
    }
    else {
      pvVar6 = malloc(sVar16 * 4 + 0x1c);
      uVar8 = (long)pvVar6 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar8 - 8) = pvVar6;
      piVar5 = (int *)(uVar8 + sVar16 * 4);
      *(undefined4 *)(uVar8 + sVar16 * 4) = 1;
      if (uVar8 != 0) {
        if (0 < (int)uVar13) {
          sVar16 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar6 = bottom_blob->data;
          uVar19 = 0;
          do {
            fVar29 = -3.4028235e+38;
            if (0 < (int)uVar9) {
              uVar21 = 0;
              fVar29 = -3.4028235e+38;
              do {
                fVar47 = *(float *)((long)pvVar6 + uVar21 * 4);
                if (fVar29 <= fVar47) {
                  fVar29 = fVar47;
                }
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            *(float *)(uVar8 + uVar19 * 4) = fVar29;
            uVar19 = uVar19 + 1;
            pvVar6 = (void *)((long)pvVar6 + sVar16 * sVar28);
          } while (uVar19 != uVar17);
          if (0 < (int)uVar13) {
            fVar29 = -3.4028235e+38;
            uVar19 = 0;
            do {
              fVar47 = *(float *)(uVar8 + uVar19 * 4);
              if (fVar29 <= fVar47) {
                fVar29 = fVar47;
              }
              uVar19 = uVar19 + 1;
            } while (uVar17 != uVar19);
            goto LAB_00116d1a;
          }
        }
        fVar29 = -3.4028235e+38;
        goto LAB_00116d1a;
      }
    }
  }
  goto LAB_001173c4;
switchD_00115e0d_caseD_ffffffff:
  uVar21 = sVar28 + 3 & 0x3ffffffffffffffc;
  lVar25 = sVar16 * uVar21;
  if (lVar25 == 0) {
    uVar8 = 0;
    piVar5 = (int *)0x0;
  }
  else {
    pvVar6 = malloc(lVar25 * 4 + 0x1c);
    uVar8 = (long)pvVar6 + 0x17U & 0xfffffffffffffff0;
    *(void **)(uVar8 - 8) = pvVar6;
    piVar5 = (int *)(uVar8 + lVar25 * 4);
    *piVar5 = 1;
    auVar52 = _DAT_00133710;
    if (uVar8 != 0) {
      uVar9 = uVar13 * (int)uVar21;
      if (0 < (int)uVar9) {
        uVar11 = 0;
        do {
          *(undefined1 (*) [16])(uVar8 + uVar11 * 4) = auVar52;
          uVar11 = uVar11 + 4;
        } while (uVar9 != uVar11);
      }
      if (0 < (int)uVar13) {
        sVar16 = bottom_blob->elemsize;
        sVar2 = bottom_blob->cstep;
        pvVar6 = bottom_blob->data;
        uVar20 = 0;
        uVar11 = uVar8;
        do {
          if (0 < (int)uVar15) {
            pvVar7 = (void *)(sVar16 * sVar2 * uVar20 + (long)pvVar6);
            uVar24 = 0;
            do {
              if (0 < (int)uVar12) {
                uVar27 = 0;
                do {
                  *(float *)(uVar11 + uVar27 * 4) =
                       *(float *)((long)pvVar7 + uVar24 * 4) * *(float *)(uVar11 + uVar27 * 4);
                  uVar27 = uVar27 + 1;
                } while (uVar19 != uVar27);
              }
              pvVar7 = (void *)((long)pvVar7 + sVar28 * 4);
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar15);
          }
          uVar20 = uVar20 + 1;
          uVar11 = uVar11 + uVar21 * 4;
        } while (uVar20 != uVar17);
      }
      auVar49 = _DAT_001334a0;
      auVar61 = _DAT_00133490;
      auVar52 = _DAT_00133420;
      uVar15 = (int)sVar26 * top_blob->c;
      if (0 < (int)uVar15) {
        pvVar6 = top_blob->data;
        lVar25 = (ulong)uVar15 - 1;
        auVar55._8_4_ = (int)lVar25;
        auVar55._0_8_ = lVar25;
        auVar55._12_4_ = (int)((ulong)lVar25 >> 0x20);
        uVar11 = 0;
        auVar55 = auVar55 ^ _DAT_00133420;
        do {
          auVar45._8_4_ = (int)uVar11;
          auVar45._0_8_ = uVar11;
          auVar45._12_4_ = (int)(uVar11 >> 0x20);
          auVar54 = (auVar45 | auVar49) ^ auVar52;
          iVar4 = auVar55._4_4_;
          if ((bool)(~(auVar54._4_4_ == iVar4 && auVar55._0_4_ < auVar54._0_4_ ||
                      iVar4 < auVar54._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4) = 0x3f800000;
          }
          if ((auVar54._12_4_ != auVar55._12_4_ || auVar54._8_4_ <= auVar55._8_4_) &&
              auVar54._12_4_ <= auVar55._12_4_) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + 4) = 0x3f800000;
          }
          auVar45 = (auVar45 | auVar61) ^ auVar52;
          iVar10 = auVar45._4_4_;
          if (iVar10 <= iVar4 && (iVar10 != iVar4 || auVar45._0_4_ <= auVar55._0_4_)) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + 8) = 0x3f800000;
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + 0xc) = 0x3f800000;
          }
          uVar11 = uVar11 + 4;
        } while ((uVar15 + 3 & 0xfffffffc) != uVar11);
      }
      if (0 < (int)uVar13) {
        pvVar6 = top_blob->data;
        uVar20 = 0;
        uVar11 = uVar8;
        do {
          if (0 < (int)uVar12) {
            uVar24 = 0;
            do {
              *(float *)((long)pvVar6 + uVar24 * 4) =
                   *(float *)(uVar11 + uVar24 * 4) * *(float *)((long)pvVar6 + uVar24 * 4);
              uVar24 = uVar24 + 1;
            } while (uVar19 != uVar24);
          }
          uVar20 = uVar20 + 1;
          uVar11 = uVar11 + uVar21 * 4;
        } while (uVar20 != uVar17);
      }
      if (0 < (int)uVar12) {
        pvVar6 = top_blob->data;
        uVar17 = 0;
        do {
          *(float *)((long)pvVar6 + uVar17 * 4) = *(float *)((long)pvVar6 + uVar17 * 4) * fVar65;
          uVar17 = uVar17 + 1;
        } while (uVar19 != uVar17);
      }
      goto LAB_00116d26;
    }
  }
  goto LAB_001173c4;
switchD_0011452f_caseD_ffffffff:
  uVar21 = sVar28 + 3 & 0x3ffffffffffffffc;
  lVar25 = sVar16 * uVar21;
  if (lVar25 == 0) {
    pvVar6 = (void *)0x0;
    local_50 = (int *)0x0;
  }
  else {
    pvVar7 = malloc(lVar25 * 4 + 0x1c);
    pvVar6 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar6 + -8) = pvVar7;
    local_50 = (int *)((long)pvVar6 + lVar25 * 4);
    *local_50 = 1;
    if (pvVar6 != (void *)0x0) {
      uVar9 = uVar13 * (int)uVar21;
      if (0 < (int)uVar9) {
        memset(pvVar6,0,(ulong)uVar9 << 2);
      }
      if (0 < (int)uVar13) {
        sVar16 = bottom_blob->elemsize;
        sVar2 = bottom_blob->cstep;
        pvVar7 = bottom_blob->data;
        uVar8 = 0;
        pvVar22 = pvVar6;
        do {
          if (0 < (int)uVar15) {
            pvVar18 = (void *)(sVar16 * sVar2 * uVar8 + (long)pvVar7);
            uVar11 = 0;
            do {
              if (0 < (int)uVar12) {
                uVar20 = 0;
                do {
                  fVar29 = *(float *)((long)pvVar18 + uVar11 * 4);
                  *(float *)((long)pvVar22 + uVar20 * 4) =
                       fVar29 * fVar29 + *(float *)((long)pvVar22 + uVar20 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar17 != uVar20);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar28 * 4);
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar15);
          }
          uVar8 = uVar8 + 1;
          pvVar22 = (void *)((long)pvVar22 + uVar21 * 4);
        } while (uVar8 != uVar19);
      }
      uVar15 = (int)sVar26 * top_blob->c;
      if (0 < (int)uVar15) {
        memset(top_blob->data,0,(ulong)uVar15 << 2);
      }
      if (0 < (int)uVar13) {
        pvVar7 = top_blob->data;
        uVar8 = 0;
        pvVar22 = pvVar6;
        do {
          if (0 < (int)uVar12) {
            uVar11 = 0;
            do {
              *(float *)((long)pvVar7 + uVar11 * 4) =
                   *(float *)((long)pvVar22 + uVar11 * 4) + *(float *)((long)pvVar7 + uVar11 * 4);
              uVar11 = uVar11 + 1;
            } while (uVar17 != uVar11);
          }
          uVar8 = uVar8 + 1;
          pvVar22 = (void *)((long)pvVar22 + uVar21 * 4);
        } while (uVar8 != uVar19);
      }
      if (0 < (int)uVar12) {
        pvVar7 = top_blob->data;
        uVar19 = 0;
        do {
          *(float *)((long)pvVar7 + uVar19 * 4) = *(float *)((long)pvVar7 + uVar19 * 4) * fVar65;
          uVar19 = uVar19 + 1;
        } while (uVar17 != uVar19);
      }
      goto LAB_00116590;
    }
  }
  goto LAB_001165b4;
switchD_00114870_caseD_ffffffff:
  uVar21 = sVar16 + 3 & 0x3ffffffffffffffc;
  lVar25 = sVar28 * uVar21;
  if (lVar25 == 0) {
    pvVar6 = (void *)0x0;
    local_50 = (int *)0x0;
  }
  else {
    pvVar7 = malloc(lVar25 * 4 + 0x1c);
    pvVar6 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar6 + -8) = pvVar7;
    local_50 = (int *)((long)pvVar6 + lVar25 * 4);
    *local_50 = 1;
    if (pvVar6 != (void *)0x0) {
      uVar9 = uVar13 * (int)uVar21;
      if (0 < (int)uVar9) {
        memset(pvVar6,0,(ulong)uVar9 << 2);
      }
      if (0 < (int)uVar13) {
        pvVar7 = bottom_blob->data;
        sVar28 = bottom_blob->elemsize;
        sVar2 = bottom_blob->cstep;
        uVar8 = 0;
        uVar9 = (uint)DAT_00133700;
        pvVar22 = pvVar6;
        do {
          if (0 < (int)uVar15) {
            pvVar18 = (void *)(sVar28 * sVar2 * uVar8 + (long)pvVar7);
            uVar11 = 0;
            do {
              if (0 < (int)uVar12) {
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar22 + uVar20 * 4) =
                       (float)(*(uint *)((long)pvVar18 + uVar11 * 4) & uVar9) +
                       *(float *)((long)pvVar22 + uVar20 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar17 != uVar20);
              }
              pvVar18 = (void *)((long)pvVar18 + sVar16 * 4);
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar15);
          }
          uVar8 = uVar8 + 1;
          pvVar22 = (void *)((long)pvVar22 + uVar21 * 4);
        } while (uVar8 != uVar19);
      }
      uVar15 = (int)sVar26 * top_blob->c;
      if (0 < (int)uVar15) {
        memset(top_blob->data,0,(ulong)uVar15 << 2);
      }
      if (0 < (int)uVar13) {
        pvVar7 = top_blob->data;
        uVar8 = 0;
        pvVar22 = pvVar6;
        do {
          if (0 < (int)uVar12) {
            uVar11 = 0;
            do {
              *(float *)((long)pvVar7 + uVar11 * 4) =
                   *(float *)((long)pvVar22 + uVar11 * 4) + *(float *)((long)pvVar7 + uVar11 * 4);
              uVar11 = uVar11 + 1;
            } while (uVar17 != uVar11);
          }
          uVar8 = uVar8 + 1;
          pvVar22 = (void *)((long)pvVar22 + uVar21 * 4);
        } while (uVar8 != uVar19);
      }
      if (0 < (int)uVar12) {
        pvVar7 = top_blob->data;
        uVar19 = 0;
        do {
          *(float *)((long)pvVar7 + uVar19 * 4) = *(float *)((long)pvVar7 + uVar19 * 4) * fVar65;
          uVar19 = uVar19 + 1;
        } while (uVar17 != uVar19);
      }
LAB_00116590:
      if (local_50 == (int *)0x0) {
        return 0;
      }
      LOCK();
      *local_50 = *local_50 + -1;
      UNLOCK();
      if (*local_50 != 0) {
        return 0;
      }
      pvVar6 = *(void **)((long)pvVar6 + -8);
      goto LAB_00116d3f;
    }
  }
LAB_001165b4:
  if (local_50 == (int *)0x0) {
    return -100;
  }
  LOCK();
  iVar4 = *local_50;
  *local_50 = *local_50 + -1;
  UNLOCK();
  if (pvVar6 == (void *)0x0) {
    return -100;
  }
  if (iVar4 != 1) {
    return -100;
  }
  pvVar6 = *(void **)((long)pvVar6 + -8);
  goto LAB_001173e0;
switchD_00116143_caseD_ffffffff:
  uVar21 = sVar28 + 3 & 0x3ffffffffffffffc;
  lVar25 = sVar16 * uVar21;
  if (lVar25 == 0) {
    uVar8 = 0;
    piVar5 = (int *)0x0;
    goto LAB_001173c4;
  }
  pvVar6 = malloc(lVar25 * 4 + 0x1c);
  uVar8 = (long)pvVar6 + 0x17U & 0xfffffffffffffff0;
  *(void **)(uVar8 - 8) = pvVar6;
  piVar5 = (int *)(uVar8 + lVar25 * 4);
  *piVar5 = 1;
  auVar52 = _DAT_00133730;
  if (uVar8 == 0) goto LAB_001173c4;
  uVar9 = uVar13 * (int)uVar21;
  if (0 < (int)uVar9) {
    uVar11 = 0;
    do {
      *(undefined1 (*) [16])(uVar8 + uVar11 * 4) = auVar52;
      uVar11 = uVar11 + 4;
    } while (uVar9 != uVar11);
  }
  if (0 < (int)uVar13) {
    sVar16 = bottom_blob->elemsize;
    sVar2 = bottom_blob->cstep;
    pvVar6 = bottom_blob->data;
    uVar20 = 0;
    uVar11 = uVar8;
    do {
      if (0 < (int)uVar15) {
        pvVar7 = (void *)(sVar16 * sVar2 * uVar20 + (long)pvVar6);
        uVar24 = 0;
        do {
          if (0 < (int)uVar12) {
            uVar27 = 0;
            do {
              fVar47 = *(float *)((long)pvVar7 + uVar24 * 4);
              fVar29 = *(float *)(uVar11 + uVar27 * 4);
              if (fVar47 <= fVar29) {
                fVar47 = fVar29;
              }
              *(float *)(uVar11 + uVar27 * 4) = fVar47;
              uVar27 = uVar27 + 1;
            } while (uVar19 != uVar27);
          }
          pvVar7 = (void *)((long)pvVar7 + sVar28 * 4);
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar15);
      }
      uVar20 = uVar20 + 1;
      uVar11 = uVar11 + uVar21 * 4;
    } while (uVar20 != uVar17);
  }
  auVar49 = _DAT_001334a0;
  auVar61 = _DAT_00133490;
  auVar52 = _DAT_00133420;
  uVar15 = (int)sVar26 * top_blob->c;
  if (0 < (int)uVar15) {
    pvVar6 = top_blob->data;
    lVar25 = (ulong)uVar15 - 1;
    auVar33._8_4_ = (int)lVar25;
    auVar33._0_8_ = lVar25;
    auVar33._12_4_ = (int)((ulong)lVar25 >> 0x20);
    uVar11 = 0;
    auVar33 = auVar33 ^ _DAT_00133420;
    do {
      auVar46._8_4_ = (int)uVar11;
      auVar46._0_8_ = uVar11;
      auVar46._12_4_ = (int)(uVar11 >> 0x20);
      auVar55 = (auVar46 | auVar49) ^ auVar52;
      iVar4 = auVar33._4_4_;
      if ((bool)(~(auVar55._4_4_ == iVar4 && auVar33._0_4_ < auVar55._0_4_ || iVar4 < auVar55._4_4_)
                & 1)) {
        *(undefined4 *)((long)pvVar6 + uVar11 * 4) = 0xff7fffff;
      }
      if ((auVar55._12_4_ != auVar33._12_4_ || auVar55._8_4_ <= auVar33._8_4_) &&
          auVar55._12_4_ <= auVar33._12_4_) {
        *(undefined4 *)((long)pvVar6 + uVar11 * 4 + 4) = 0xff7fffff;
      }
      auVar55 = (auVar46 | auVar61) ^ auVar52;
      iVar10 = auVar55._4_4_;
      if (iVar10 <= iVar4 && (iVar10 != iVar4 || auVar55._0_4_ <= auVar33._0_4_)) {
        *(undefined4 *)((long)pvVar6 + uVar11 * 4 + 8) = 0xff7fffff;
        *(undefined4 *)((long)pvVar6 + uVar11 * 4 + 0xc) = 0xff7fffff;
      }
      uVar11 = uVar11 + 4;
    } while ((uVar15 + 3 & 0xfffffffc) != uVar11);
  }
  if (0 < (int)uVar13) {
    pvVar6 = top_blob->data;
    uVar20 = 0;
    uVar11 = uVar8;
    do {
      if (0 < (int)uVar12) {
        uVar24 = 0;
        do {
          fVar47 = *(float *)(uVar11 + uVar24 * 4);
          fVar29 = *(float *)((long)pvVar6 + uVar24 * 4);
          if (fVar47 <= fVar29) {
            fVar47 = fVar29;
          }
          *(float *)((long)pvVar6 + uVar24 * 4) = fVar47;
          uVar24 = uVar24 + 1;
        } while (uVar19 != uVar24);
      }
      uVar20 = uVar20 + 1;
      uVar11 = uVar11 + uVar21 * 4;
    } while (uVar20 != uVar17);
  }
  if (0 < (int)uVar12) {
    pvVar6 = top_blob->data;
    uVar17 = 0;
    do {
      *(float *)((long)pvVar6 + uVar17 * 4) = *(float *)((long)pvVar6 + uVar17 * 4) * fVar65;
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
  }
LAB_00116d26:
  if (piVar5 == (int *)0x0) {
    return 0;
  }
  LOCK();
  *piVar5 = *piVar5 + -1;
  UNLOCK();
  if (*piVar5 != 0) {
    return 0;
  }
  pvVar6 = *(void **)(uVar8 - 8);
LAB_00116d3f:
  free(pvVar6);
  return 0;
switchD_001159fb_caseD_ffffffff:
  uVar21 = sVar28 + 3 & 0x3ffffffffffffffc;
  lVar25 = sVar16 * uVar21;
  if (lVar25 == 0) {
    uVar8 = 0;
    piVar5 = (int *)0x0;
  }
  else {
    pvVar6 = malloc(lVar25 * 4 + 0x1c);
    uVar8 = (long)pvVar6 + 0x17U & 0xfffffffffffffff0;
    *(void **)(uVar8 - 8) = pvVar6;
    piVar5 = (int *)(uVar8 + lVar25 * 4);
    *piVar5 = 1;
    auVar52 = _DAT_00133720;
    if (uVar8 != 0) {
      uVar9 = uVar13 * (int)uVar21;
      if (0 < (int)uVar9) {
        uVar11 = 0;
        do {
          *(undefined1 (*) [16])(uVar8 + uVar11 * 4) = auVar52;
          uVar11 = uVar11 + 4;
        } while (uVar9 != uVar11);
      }
      if (0 < (int)uVar13) {
        sVar16 = bottom_blob->elemsize;
        sVar2 = bottom_blob->cstep;
        pvVar6 = bottom_blob->data;
        uVar20 = 0;
        uVar11 = uVar8;
        do {
          if (0 < (int)uVar15) {
            pvVar7 = (void *)(sVar16 * sVar2 * uVar20 + (long)pvVar6);
            uVar24 = 0;
            do {
              if (0 < (int)uVar12) {
                uVar27 = 0;
                do {
                  fVar47 = *(float *)((long)pvVar7 + uVar24 * 4);
                  fVar29 = *(float *)(uVar11 + uVar27 * 4);
                  if (fVar29 <= fVar47) {
                    fVar47 = fVar29;
                  }
                  *(float *)(uVar11 + uVar27 * 4) = fVar47;
                  uVar27 = uVar27 + 1;
                } while (uVar19 != uVar27);
              }
              pvVar7 = (void *)((long)pvVar7 + sVar28 * 4);
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar15);
          }
          uVar20 = uVar20 + 1;
          uVar11 = uVar11 + uVar21 * 4;
        } while (uVar20 != uVar17);
      }
      auVar49 = _DAT_001334a0;
      auVar61 = _DAT_00133490;
      auVar52 = _DAT_00133420;
      uVar15 = (int)sVar26 * top_blob->c;
      if (0 < (int)uVar15) {
        pvVar6 = top_blob->data;
        lVar25 = (ulong)uVar15 - 1;
        auVar32._8_4_ = (int)lVar25;
        auVar32._0_8_ = lVar25;
        auVar32._12_4_ = (int)((ulong)lVar25 >> 0x20);
        uVar11 = 0;
        auVar32 = auVar32 ^ _DAT_00133420;
        do {
          auVar44._8_4_ = (int)uVar11;
          auVar44._0_8_ = uVar11;
          auVar44._12_4_ = (int)(uVar11 >> 0x20);
          auVar55 = (auVar44 | auVar49) ^ auVar52;
          iVar4 = auVar32._4_4_;
          if ((bool)(~(auVar55._4_4_ == iVar4 && auVar32._0_4_ < auVar55._0_4_ ||
                      iVar4 < auVar55._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4) = 0x7f7fffff;
          }
          if ((auVar55._12_4_ != auVar32._12_4_ || auVar55._8_4_ <= auVar32._8_4_) &&
              auVar55._12_4_ <= auVar32._12_4_) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + 4) = 0x7f7fffff;
          }
          auVar55 = (auVar44 | auVar61) ^ auVar52;
          iVar10 = auVar55._4_4_;
          if (iVar10 <= iVar4 && (iVar10 != iVar4 || auVar55._0_4_ <= auVar32._0_4_)) {
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + 8) = 0x7f7fffff;
            *(undefined4 *)((long)pvVar6 + uVar11 * 4 + 0xc) = 0x7f7fffff;
          }
          uVar11 = uVar11 + 4;
        } while ((uVar15 + 3 & 0xfffffffc) != uVar11);
      }
      if (0 < (int)uVar13) {
        pvVar6 = top_blob->data;
        uVar20 = 0;
        uVar11 = uVar8;
        do {
          if (0 < (int)uVar12) {
            uVar24 = 0;
            do {
              fVar47 = *(float *)(uVar11 + uVar24 * 4);
              fVar29 = *(float *)((long)pvVar6 + uVar24 * 4);
              if (fVar29 <= fVar47) {
                fVar47 = fVar29;
              }
              *(float *)((long)pvVar6 + uVar24 * 4) = fVar47;
              uVar24 = uVar24 + 1;
            } while (uVar19 != uVar24);
          }
          uVar20 = uVar20 + 1;
          uVar11 = uVar11 + uVar21 * 4;
        } while (uVar20 != uVar17);
      }
      if (0 < (int)uVar12) {
        pvVar6 = top_blob->data;
        uVar17 = 0;
        do {
          *(float *)((long)pvVar6 + uVar17 * 4) = *(float *)((long)pvVar6 + uVar17 * 4) * fVar65;
          uVar17 = uVar17 + 1;
        } while (uVar19 != uVar17);
      }
      goto LAB_00116d26;
    }
  }
LAB_001173c4:
  if (piVar5 != (int *)0x0) {
    LOCK();
    iVar4 = *piVar5;
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if ((uVar8 != 0) && (iVar4 == 1)) {
LAB_001173dc:
      pvVar6 = *(void **)(uVar8 - 8);
LAB_001173e0:
      free(pvVar6);
    }
  }
  return -100;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    if (operation == ReductionOp_SUM)
        return reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_ASUM)
        return reduction_op< reduction_op_asum<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_SUMSQ)
        return reduction_op< reduction_op_sumsq<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_MEAN)
    {
        int ret = reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);
        if (ret != 0)
            return -100;

        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        if (dim == 0)
        {
            top_blob[0] /= channels * size;
        }
        else if (dim == 1)
        {
            for (int q=0; q<channels; q++)
            {
                top_blob[q] /= size;
            }
        }
        else if (dim == 2)
        {
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<h; i++)
                {
                    outptr[i] /= w;
                }
            }
        }
        else if (dim == -1)
        {
            for (int j=0; j<w; j++)
            {
                top_blob[j] /= h * channels;
            }
        }
        else if (dim == -2)
        {
            for (int i=0; i<size; i++)
            {
                top_blob[i] /= channels;
            }
        }
    }

    if (operation == ReductionOp_MAX)
        return reduction_op< reduction_op_max<float>, reduction_op_max<float> >(bottom_blob, top_blob, -FLT_MAX, dim, coeff);

    if (operation == ReductionOp_MIN)
        return reduction_op< reduction_op_min<float>, reduction_op_min<float> >(bottom_blob, top_blob, FLT_MAX, dim, coeff);

    if (operation == ReductionOp_PROD)
        return reduction_op< std::multiplies<float>, std::multiplies<float> >(bottom_blob, top_blob, 1.f, dim, coeff);

    return 0;
}